

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

char * wrap_get_ptypes(short *S,vrna_md_t *md)

{
  int iVar1;
  uint length;
  char *pcVar2;
  int *__ptr;
  int local_50;
  int local_4c;
  int otype;
  int ntype;
  int type;
  int min_loop_size;
  int *idx;
  int local_30;
  int l;
  int k;
  int j;
  int i;
  int n;
  char *ptype;
  vrna_md_t *md_local;
  short *S_local;
  
  length = (uint)*S;
  pcVar2 = (char *)vrna_alloc((int)(length * (length + 1)) / 2 + 2);
  __ptr = vrna_idx_row_wise(length);
  iVar1 = md->min_loop_size;
  for (local_30 = 1; local_30 < (int)(length - iVar1); local_30 = local_30 + 1) {
    for (idx._4_4_ = 1; idx._4_4_ < 3; idx._4_4_ = idx._4_4_ + 1) {
      local_4c = 0;
      local_50 = 0;
      k = local_30;
      l = local_30 + iVar1 + idx._4_4_;
      if (l <= (int)length) {
        otype = md->pair[S[local_30]][S[l]];
        for (; 0 < k && l <= (int)length; k = k + -1) {
          if ((1 < k) && (l < (int)length)) {
            local_4c = md->pair[S[k + -1]][S[l + 1]];
          }
          if (((md->noLP != 0) && (local_50 == 0)) && (local_4c == 0)) {
            otype = 0;
          }
          pcVar2[__ptr[k] - l] = (char)otype;
          local_50 = otype;
          otype = local_4c;
          l = l + 1;
        }
      }
    }
  }
  free(__ptr);
  return pcVar2;
}

Assistant:

PRIVATE char *
wrap_get_ptypes(const short *S,
                vrna_md_t   *md)
{
  char  *ptype;
  int   n, i, j, k, l, *idx;

  n     = S[0];
  ptype = (char *)vrna_alloc(sizeof(char) * ((n * (n + 1)) / 2 + 2));
  idx   = vrna_idx_row_wise(n);
  int   min_loop_size = md->min_loop_size;

  for (k = 1; k < n - min_loop_size; k++)
    for (l = 1; l <= 2; l++) {
      int type, ntype = 0, otype = 0;
      i = k;
      j = i + min_loop_size + l;
      if (j > n)
        continue;

      type = md->pair[S[i]][S[j]];
      while ((i >= 1) && (j <= n)) {
        if ((i > 1) && (j < n))
          ntype = md->pair[S[i - 1]][S[j + 1]];

        if (md->noLP && (!otype) && (!ntype))
          type = 0; /* i.j can only form isolated pairs */

        ptype[idx[i] - j] = (char)type;
        otype             = type;
        type              = ntype;
        i--;
        j++;
      }
    }
  free(idx);
  return ptype;
}